

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlersPostChild.h
# Opt level: O0

error_t ArgumentHandlers::parse_main(int key,char *arg,argp_state *state)

{
  undefined8 uVar1;
  uint uVar2;
  long in_RDX;
  int in_EDI;
  uint i;
  arguments *theArgumentsStruc;
  uint local_24;
  error_t local_4;
  
  uVar1 = *(undefined8 *)(in_RDX + 0x28);
  if (in_EDI == 0x1000003) {
    local_24 = 0;
    while( true ) {
      uVar2 = size<argp_child_const,7u>(&childVector);
      if (uVar2 <= local_24) break;
      *(undefined8 *)(*(long *)(in_RDX + 0x30) + (ulong)local_24 * 8) = uVar1;
      local_24 = local_24 + 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

static error_t
parse_main (int key, char *arg, struct argp_state *state)
{
    struct arguments *theArgumentsStruc = (struct arguments*) state->input;
    switch (key)
    {
        case ARGP_KEY_INIT:
            //give child_parsers access to the arguments structure on 
            //initialization.
            for(unsigned i = 0; i < size(childVector); i++)
                state->child_inputs[i] = theArgumentsStruc;
            break;
        default:
            return ARGP_ERR_UNKNOWN;
    }
    return 0;
}